

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thrd_join.c
# Opt level: O2

int thrd_join(thrd_t thr,int *res)

{
  int iVar1;
  void *result;
  int local_10 [2];
  
  iVar1 = pthread_join(thr,(void **)local_10);
  if (res != (int *)0x0) {
    *res = local_10[0];
  }
  return (uint)(iVar1 != 0) * 2 + 1;
}

Assistant:

int thrd_join( thrd_t thr, int * res )
{
    void * result;
    int rc = pthread_join( thr, &result );

    if ( res != NULL )
    {
        *res = ( int )( uintptr_t )result;
    }

    if ( rc == 0 )
    {
        return thrd_success;
    }
    else
    {
        return thrd_error;
    }
}